

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

bool google::protobuf::internal::WireFormatLite::ReadPackedEnumPreserveUnknowns
               (CodedInputStream *input,int field_number,_func_bool_int *is_valid,
               CodedOutputStream *unknown_fields_stream,RepeatedField<int> *values)

{
  byte bVar1;
  bool bVar2;
  Limit limit;
  int iVar3;
  int64 iVar4;
  ulong uVar5;
  byte *pbVar6;
  byte *pbVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int tmp;
  uint32 first_byte_or_zero;
  
  pbVar6 = input->buffer_;
  if (pbVar6 < input->buffer_end_) {
    uVar11 = (uint)*pbVar6;
    if (-1 < (char)*pbVar6) {
      input->buffer_ = pbVar6 + 1;
      goto LAB_001dde40;
    }
  }
  else {
    uVar11 = 0;
  }
  iVar4 = io::CodedInputStream::ReadVarint32Fallback(input,uVar11);
  uVar11 = (uint)iVar4;
  if (iVar4 < 0) {
    return false;
  }
LAB_001dde40:
  limit = io::CodedInputStream::PushLimit(input,uVar11);
  iVar3 = io::CodedInputStream::BytesUntilLimit(input);
  if (0 < iVar3) {
    uVar11 = field_number << 3;
    do {
      pbVar6 = input->buffer_;
      if (pbVar6 < input->buffer_end_) {
        bVar1 = *pbVar6;
        uVar5 = (ulong)bVar1;
        first_byte_or_zero = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_001dde90;
        input->buffer_ = pbVar6 + 1;
      }
      else {
        first_byte_or_zero = 0;
LAB_001dde90:
        uVar5 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
        if ((long)uVar5 < 0) {
          return false;
        }
      }
      uVar9 = (uint)uVar5;
      if ((is_valid == (_func_bool_int *)0x0) || (bVar2 = (*is_valid)(uVar9), bVar2)) {
        uVar10 = values->current_size_;
        if (uVar10 == values->total_size_) {
          RepeatedField<int>::Reserve(values,uVar10 + 1);
          *(uint *)((long)values->arena_or_elements_ + (ulong)uVar10 * 4) = uVar9;
        }
        else {
          *(uint *)((long)values->arena_or_elements_ + (ulong)uVar10 * 4) = uVar9;
        }
        values->current_size_ = uVar10 + 1;
      }
      else {
        pbVar6 = unknown_fields_stream->cur_;
        if ((unknown_fields_stream->impl_).end_ <= pbVar6) {
          pbVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback
                             (&unknown_fields_stream->impl_,pbVar6);
        }
        if (uVar11 < 0x80) {
          *pbVar6 = (byte)uVar11;
          pbVar6 = pbVar6 + 1;
        }
        else {
          *pbVar6 = (byte)uVar11 | 0x80;
          if (uVar11 < 0x4000) {
            pbVar6[1] = (byte)(uVar11 >> 7);
            pbVar6 = pbVar6 + 2;
          }
          else {
            pbVar6 = pbVar6 + 2;
            uVar10 = uVar11 >> 7;
            do {
              pbVar7 = pbVar6;
              pbVar7[-1] = (byte)uVar10 | 0x80;
              uVar8 = uVar10 >> 7;
              pbVar6 = pbVar7 + 1;
              bVar2 = 0x3fff < uVar10;
              uVar10 = uVar8;
            } while (bVar2);
            *pbVar7 = (byte)uVar8;
          }
        }
        unknown_fields_stream->cur_ = pbVar6;
        if ((unknown_fields_stream->impl_).end_ <= pbVar6) {
          pbVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback
                             (&unknown_fields_stream->impl_,pbVar6);
        }
        if (uVar9 < 0x80) {
          *pbVar6 = (byte)uVar5;
          pbVar6 = pbVar6 + 1;
        }
        else {
          *pbVar6 = (byte)uVar5 | 0x80;
          uVar5 = uVar5 >> 7 & 0x1ffffff;
          if (uVar9 < 0x4000) {
            pbVar6[1] = (byte)uVar5;
            pbVar6 = pbVar6 + 2;
          }
          else {
            pbVar6 = pbVar6 + 2;
            do {
              pbVar7 = pbVar6;
              uVar9 = (uint)uVar5;
              pbVar7[-1] = (byte)uVar5 | 0x80;
              uVar10 = uVar9 >> 7;
              uVar5 = (ulong)uVar10;
              pbVar6 = pbVar7 + 1;
            } while (0x3fff < uVar9);
            *pbVar7 = (byte)uVar10;
          }
        }
        unknown_fields_stream->cur_ = pbVar6;
      }
      iVar3 = io::CodedInputStream::BytesUntilLimit(input);
    } while (0 < iVar3);
  }
  io::CodedInputStream::PopLimit(input,limit);
  return true;
}

Assistant:

bool WireFormatLite::ReadPackedEnumPreserveUnknowns(
    io::CodedInputStream* input, int field_number, bool (*is_valid)(int),
    io::CodedOutputStream* unknown_fields_stream, RepeatedField<int>* values) {
  uint32 length;
  if (!input->ReadVarint32(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    int value;
    if (!ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(input, &value)) {
      return false;
    }
    if (is_valid == NULL || is_valid(value)) {
      values->Add(value);
    } else {
      uint32 tag = WireFormatLite::MakeTag(field_number,
                                           WireFormatLite::WIRETYPE_VARINT);
      unknown_fields_stream->WriteVarint32(tag);
      unknown_fields_stream->WriteVarint32(value);
    }
  }
  input->PopLimit(limit);
  return true;
}